

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O2

int new_transaction(scep *s)

{
  PKCS7_ISSUER_AND_SUBJECT *pPVar1;
  PKCS7_ISSUER_AND_SERIAL *pPVar2;
  char *pcVar3;
  
  memset(s,0,0xd8);
  s->pki_status = 99;
  s->fail_info_str = (char *)0x0;
  pPVar1 = PKCS7_ISSUER_AND_SUBJECT_new();
  s->ias_getcertinit = pPVar1;
  pPVar2 = PKCS7_ISSUER_AND_SERIAL_new();
  s->ias_getcert = (PKCS7_ISSUER_AND_SERIAL *)pPVar2;
  pPVar2 = PKCS7_ISSUER_AND_SERIAL_new();
  s->ias_getcrl = (PKCS7_ISSUER_AND_SERIAL *)pPVar2;
  if (operation_flag == 3) {
    pcVar3 = key_fingerprint(request);
  }
  else {
    pcVar3 = "SSCEP transactionId";
  }
  s->transaction_id = pcVar3;
  log_log(1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/sceputils.c"
          ,0x25,"transaction id: %s");
  return 0;
}

Assistant:

int new_transaction(struct scep *s) {

    // Set the whole struct as 0
    memset(s, 0, sizeof(*s));

    // Set request and reply type
    s->request_type = SCEP_REQUEST_NONE;
    s->request_type_str = NULL;
    s->reply_type = SCEP_REPLY_NONE;
    s->reply_type_str = NULL;
    s->pki_status = SCEP_PKISTATUS_UNSET;
    s->pki_status_str = NULL;
    s->fail_info_str = NULL;

    // Set other variables
    s->ias_getcertinit = PKCS7_ISSUER_AND_SUBJECT_new();
    s->ias_getcert = PKCS7_ISSUER_AND_SERIAL_new();
    s->ias_getcrl = PKCS7_ISSUER_AND_SERIAL_new();

    // Create transaction id
    if (operation_flag == SCEP_OPERATION_ENROLL)
        s->transaction_id = key_fingerprint(request);
    else
        s->transaction_id = TRANS_ID_GETCERT;
    log_debug("transaction id: %s", s->transaction_id);
    return (0);
}